

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

Color ColorFromHSV(float hue,float saturation,float value)

{
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float t;
  float k;
  float value_local;
  float saturation_local;
  float hue_local;
  Color color;
  
  local_24 = fmodf(hue / 60.0 + 5.0,6.0);
  if (4.0 - local_24 < local_24) {
    local_24 = 4.0 - local_24;
  }
  if (1.0 <= local_24) {
    local_28 = 1.0;
  }
  else {
    local_28 = local_24;
  }
  if (local_28 <= 0.0) {
    local_2c = 0.0;
  }
  else {
    local_2c = local_28;
  }
  local_30 = fmodf(hue / 60.0 + 3.0,6.0);
  if (4.0 - local_30 < local_30) {
    local_30 = 4.0 - local_30;
  }
  if (1.0 <= local_30) {
    local_34 = 1.0;
  }
  else {
    local_34 = local_30;
  }
  if (local_34 <= 0.0) {
    local_38 = 0.0;
  }
  else {
    local_38 = local_34;
  }
  local_3c = fmodf(hue / 60.0 + 1.0,6.0);
  if (4.0 - local_3c < local_3c) {
    local_3c = 4.0 - local_3c;
  }
  if (1.0 <= local_3c) {
    local_40 = 1.0;
  }
  else {
    local_40 = local_3c;
  }
  if (local_40 <= 0.0) {
    local_44 = 0.0;
  }
  else {
    local_44 = local_40;
  }
  saturation_local =
       (float)CONCAT13(0xff,CONCAT12((char)(int)((value - value * saturation * local_44) * 255.0),
                                     CONCAT11((char)(int)((value - value * saturation * local_38) *
                                                         255.0),
                                              (char)(int)((value - value * saturation * local_2c) *
                                                         255.0))));
  return (Color)saturation_local;
}

Assistant:

Color ColorFromHSV(float hue, float saturation, float value)
{
    Color color = { 0, 0, 0, 255 };

    // Red channel
    float k = fmodf((5.0f + hue/60.0f), 6);
    float t = 4.0f - k;
    k = (t < k)? t : k;
    k = (k < 1)? k : 1;
    k = (k > 0)? k : 0;
    color.r = (unsigned char)((value - value*saturation*k)*255.0f);

    // Green channel
    k = fmodf((3.0f + hue/60.0f), 6);
    t = 4.0f - k;
    k = (t < k)? t : k;
    k = (k < 1)? k : 1;
    k = (k > 0)? k : 0;
    color.g = (unsigned char)((value - value*saturation*k)*255.0f);

    // Blue channel
    k = fmodf((1.0f + hue/60.0f), 6);
    t = 4.0f - k;
    k = (t < k)? t : k;
    k = (k < 1)? k : 1;
    k = (k > 0)? k : 0;
    color.b = (unsigned char)((value - value*saturation*k)*255.0f);

    return color;
}